

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhashfunctions.h
# Opt level: O2

result_type __thiscall QtPrivate::QHashCombine::operator()(QHashCombine *this,size_t seed,Type *t)

{
  ulong uVar1;
  
  uVar1 = ((ulong)*t * -0x2917014799a6026d >> 0x20 ^ (ulong)*t * -0x2917014799a6026d) *
          -0x2917014799a6026d;
  return (seed >> 2) + seed * 0x40 + 0x9e3779b9 + (uVar1 >> 0x20 ^ uVar1) ^ seed;
}

Assistant:

constexpr result_type operator()(size_t seed, const T &t) const
        noexcept(noexcept(qHash(t, seed)))
    // combiner taken from N3876 / boost::hash_combine
    { return seed ^ (qHash(t, size_t(0)) + 0x9e3779b9 + (seed << 6) + (seed >> 2)); }